

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O3

IntrinsicResult intrinsic_feof(Context *context,IntrinsicResult partialResult)

{
  ValueType VVar1;
  anon_union_8_3_2f476f46_for_data aVar2;
  ListStorage<MiniScript::TACLine> *pLVar3;
  int iVar4;
  long *plVar5;
  undefined4 *puVar6;
  Value fileWrapper;
  Value self;
  Value local_68;
  Value local_58;
  long *local_48;
  char local_40;
  undefined1 local_38 [32];
  
  local_40 = '\0';
  plVar5 = (long *)operator_new(0x30);
  plVar5[1] = 1;
  *plVar5 = (long)&PTR__StringStorage_001bf0d8;
  plVar5[3] = 5;
  plVar5[4] = -1;
  puVar6 = (undefined4 *)operator_new__(5);
  plVar5[2] = (long)puVar6;
  *(undefined1 *)(puVar6 + 1) = 0;
  *puVar6 = 0x666c6573;
  local_48 = plVar5;
  MiniScript::Context::GetVar
            ((Context *)local_38,(String *)partialResult.rs,(LocalOnlyMode)&local_48);
  if ((local_48 != (long *)0x0) && (local_40 == '\0')) {
    plVar5 = local_48 + 1;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (**(code **)(*local_48 + 8))();
    }
    local_48 = (long *)0x0;
  }
  aVar2 = _handle.data;
  VVar1 = _handle.type;
  if (_handle.data.ref != (RefCountedStorage *)0x0 && Temp < _handle.type) {
    (_handle.data.ref)->refCount = (_handle.data.ref)->refCount + 1;
  }
  MiniScript::Value::Lookup(&local_58,(Value *)local_38);
  if ((Temp < VVar1) && (aVar2.ref != (RefCountedStorage *)0x0)) {
    plVar5 = &(aVar2.ref)->refCount;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*(aVar2.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  if (local_58.type == Handle) {
    if ((FILE *)local_58.data.ref[1]._vptr_RefCountedStorage != (FILE *)0x0) {
      iVar4 = feof((FILE *)local_58.data.ref[1]._vptr_RefCountedStorage);
      MiniScript::Value::Truth(&local_68,iVar4 != 0);
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 &local_68);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_68.type) && (local_68.data.ref != (RefCountedStorage *)0x0)) {
        plVar5 = &(local_68.data.ref)->refCount;
        *plVar5 = *plVar5 + -1;
        if (*plVar5 == 0) {
          (*(local_68.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_68.data.number = 0.0;
      }
      goto LAB_0012bdcf;
    }
    MiniScript::IntrinsicResult::ensureStorage
              ((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  }
  else {
    MiniScript::IntrinsicResult::ensureStorage
              ((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  }
  pLVar3 = MiniScript::IntrinsicResult::Null;
  (context->code).ls = MiniScript::IntrinsicResult::Null;
  if (pLVar3 != (ListStorage<MiniScript::TACLine> *)0x0) {
    plVar5 = &(pLVar3->super_RefCountedStorage).refCount;
    *plVar5 = *plVar5 + 1;
  }
LAB_0012bdcf:
  if ((Temp < local_58.type) && (local_58.data.ref != (RefCountedStorage *)0x0)) {
    plVar5 = &(local_58.data.ref)->refCount;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*(local_58.data.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  if ((Temp < local_38[0]) && ((RefCountedStorage *)local_38._8_8_ != (RefCountedStorage *)0x0)) {
    plVar5 = (long *)(local_38._8_8_ + 8);
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*(*(_func_int ***)local_38._8_8_)[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_feof(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	
	Value fileWrapper = self.Lookup(_handle);
	if (fileWrapper.IsNull() or fileWrapper.type != ValueType::Handle) return IntrinsicResult::Null;
	FileHandleStorage *storage = (FileHandleStorage*)fileWrapper.data.ref;
	FILE *handle = storage->f;
	if (handle == nullptr) return IntrinsicResult::Null;

	// Note: feof returns true only after attempting to read PAST the end of the file.
	// Not after the last successful read.  See: https://stackoverflow.com/questions/34888776
	return IntrinsicResult(Value::Truth(feof(handle) != 0));
}